

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecompress(tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar *dstBuf,int width,
                int pitch,int height,int pixelSize,int flags)

{
  int iVar1;
  undefined8 in_RCX;
  uchar *in_RDX;
  unsigned_long in_RSI;
  uchar *in_RDI;
  int in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  unsigned_long in_stack_ffffffffffffffa0;
  uchar *in_stack_ffffffffffffffa8;
  tjhandle in_stack_ffffffffffffffb0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_stack_00000018 & 0x200) == 0) {
    getPixelFormat(in_stack_00000010,in_stack_00000018);
    iVar1 = tjDecompress2((tjhandle)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          in_RDI,in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                          in_stack_00000010,in_stack_00000018,in_stack_00000020);
  }
  else {
    iVar1 = tjDecompressToYUV(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                              in_stack_ffffffffffffffa0,
                              (uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                              ,in_stack_ffffffffffffff94);
  }
  return iVar1;
}

Assistant:

DLLEXPORT int tjDecompress(tjhandle handle, unsigned char *jpegBuf,
                           unsigned long jpegSize, unsigned char *dstBuf,
                           int width, int pitch, int height, int pixelSize,
                           int flags)
{
  if (flags & TJ_YUV)
    return tjDecompressToYUV(handle, jpegBuf, jpegSize, dstBuf, flags);
  else
    return tjDecompress2(handle, jpegBuf, jpegSize, dstBuf, width, pitch,
                         height, getPixelFormat(pixelSize, flags), flags);
}